

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::Config::from_file
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          Config *this,string *name)

{
  FileError *__return_storage_ptr___00;
  string local_250;
  ifstream input;
  int aiStack_210 [122];
  
  ::std::ifstream::ifstream(&input,(string *)name,_S_in);
  if (*(int *)((long)aiStack_210 + *(long *)(_input + -0x18)) == 0) {
    (*this->_vptr_Config[1])(__return_storage_ptr__,this,&input);
    ::std::ifstream::~ifstream(&input);
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 = (FileError *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string((string *)&local_250,(string *)name);
  FileError::Missing(__return_storage_ptr___00,&local_250);
  __cxa_throw(__return_storage_ptr___00,&FileError::typeinfo,Error::~Error);
}

Assistant:

std::vector<ConfigItem> from_file(const std::string &name) const {
        std::ifstream input{name};
        if(!input.good())
            throw FileError::Missing(name);

        return from_config(input);
    }